

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphmesh.cpp
# Opt level: O3

void __thiscall
TPZGraphMesh::TPZGraphMesh
          (TPZGraphMesh *this,TPZCompMesh *cm,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalarnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames)

{
  TPZAdmChunkVector<TPZGraphEl_*,_10> *this_00;
  TPZAdmChunkVector<TPZGraphNode,_10> *this_01;
  TPZCompMesh *pTVar1;
  long lVar2;
  TPZCompEl *pTVar3;
  TPZCompEl **ppTVar4;
  long nelem;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZGraphMesh_0196f2d0;
  this->fCompMesh = cm;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&(this->fMaterialIds)._M_t,&matids->_M_t);
  this->fDimension = dimension;
  this_00 = &this->fElementList;
  TPZAdmChunkVector<TPZGraphEl_*,_10>::TPZAdmChunkVector(this_00,100);
  this_01 = &this->fNodeMap;
  TPZAdmChunkVector<TPZGraphNode,_10>::TPZAdmChunkVector(this_01,100);
  std::ofstream::ofstream(&this->fOutFile);
  (this->fFileName)._M_dataplus._M_p = (pointer)&(this->fFileName).field_2;
  (this->fFileName)._M_string_length = 0;
  (this->fFileName).field_2._M_local_buf[0] = '\0';
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
            (&this->fScalarNames,scalarnames);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
            (&this->fVecNames,vecnames);
  (this->fTensorNames)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181b468;
  (this->fTensorNames).fStore =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->fTensorNames).fNElements = 0;
  (this->fTensorNames).fNAlloc = 0;
  TPZAdmChunkVector<TPZGraphEl_*,_10>::Resize(this_00,0);
  TPZAdmChunkVector<TPZGraphEl_*,_10>::CompactDataStructure(this_00,NOW);
  TPZAdmChunkVector<TPZGraphNode,_10>::Resize(this_01,0);
  TPZAdmChunkVector<TPZGraphNode,_10>::CompactDataStructure(this_01,NOW);
  pTVar1 = this->fCompMesh;
  lVar2 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar2) {
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar3 = *ppTVar4;
      if (pTVar3 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar3 + 0x148))(pTVar3,this,dimension);
      }
      nelem = nelem + 1;
    } while (lVar2 != nelem);
  }
  return;
}

Assistant:

TPZGraphMesh::TPZGraphMesh(TPZCompMesh *cm, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalarnames, const TPZVec<std::string> &vecnames) :
    fCompMesh(cm), fDimension(dimension), fMaterialIds(matids), fScalarNames(scalarnames), fVecNames(vecnames), fTensorNames()
{
	int64_t nel,i;
	fElementList.Resize(0);
	fElementList.CompactDataStructure(fElementList.NOW);
	fNodeMap.Resize(0);
	fNodeMap.CompactDataStructure(fNodeMap.NOW);
	
	TPZAdmChunkVector<TPZCompEl *> &celvec = fCompMesh->ElementVec();
	TPZCompEl *ce;
	nel = celvec.NElements();
	for(i=0;i<nel;i++) {
		ce = (TPZCompEl *) celvec[i];
		if(!ce) continue;
		ce->CreateGraphicalElement(*this, dimension);
	}
	
}